

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void print_reconstruction_frame(YV12_BUFFER_CONFIG *last_frame,int frame_number,int do_print)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  FILE *recon_file;
  char filename [512];
  FILE *local_220;
  char local_218 [524];
  uint local_c;
  long local_8;
  
  if (in_EDX != 0) {
    local_c = in_ESI;
    local_8 = in_RDI;
    snprintf(local_218,0x200,"enc%04d.yuv",(ulong)in_ESI);
    if (local_c == 0) {
      local_220 = fopen64(local_218,"wb");
    }
    else {
      local_220 = fopen64(local_218,"ab");
    }
    fwrite(*(void **)(local_8 + 0x70),*(size_t *)(local_8 + 0x88),1,local_220);
    fclose(local_220);
  }
  return;
}

Assistant:

static void print_reconstruction_frame(
    const YV12_BUFFER_CONFIG *const last_frame, int frame_number,
    int do_print) {
  if (!do_print) return;

  char filename[512];
  FILE *recon_file;
  snprintf(filename, sizeof(filename), "enc%04d.yuv", frame_number);

  if (frame_number == 0) {
    recon_file = fopen(filename, "wb");
  } else {
    recon_file = fopen(filename, "ab");
  }

  fwrite(last_frame->buffer_alloc, last_frame->frame_size, 1, recon_file);
  fclose(recon_file);
}